

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

void __thiscall rsg::ConditionalStatement::~ConditionalStatement(ConditionalStatement *this)

{
  ~ConditionalStatement(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

ConditionalStatement::~ConditionalStatement (void)
{
	delete m_condition;
	delete m_trueStatement;
	delete m_falseStatement;
}